

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

string * __thiscall
pbrt::FormattingScene::upgradeMaterial
          (string *__return_storage_ptr__,FormattingScene *this,string *name,
          ParameterDictionary *dict,FileLoc loc)

{
  float fVar1;
  long lVar2;
  ParameterDictionary *pPVar3;
  size_type sVar4;
  bool bVar5;
  Allocator alloc;
  RGB *pRVar6;
  RGB *pRVar7;
  RGB *pRVar8;
  ParameterDictionary *pPVar9;
  Float *args_1;
  char *paramName;
  string *this_00;
  optional<pbrt::RGB> *this_01;
  Allocator in_R8;
  Float value;
  string m1;
  ParameterDictionary *dict_local;
  optional<pbrt::RGB> opacity;
  string *name_local;
  undefined4 local_e4;
  string local_e0;
  allocator<char> local_b9;
  optional<pbrt::RGB> rgb;
  Float avg;
  anon_class_24_3_a769f4f6 removeParamSilentIfConstant;
  string extra;
  string local_48;
  
  pPVar9 = dict;
  dict_local = dict;
  name_local = name;
  upgradeMaterialIndex(&extra,this,name,dict,loc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m1,"bumpmap",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&opacity,"displacement",(allocator<char> *)&avg);
  ParameterDictionary::RenameParameter(dict,&m1,(string *)&opacity);
  std::__cxx11::string::~string((string *)&opacity);
  std::__cxx11::string::~string((string *)&m1);
  removeParamSilentIfConstant.name = &name_local;
  removeParamSilentIfConstant.dict = &dict_local;
  removeParamSilentIfConstant.loc = &loc;
  bVar5 = std::operator==(name_local,"uber");
  if (bVar5) {
    std::__cxx11::string::assign((char *)name_local);
    bVar5 = upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                      (&removeParamSilentIfConstant,"Ks",0.0);
    if (bVar5) {
      std::__cxx11::string::assign((char *)name_local);
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"eta",(allocator<char> *)&opacity);
      ParameterDictionary::RemoveFloat(pPVar9,&m1);
      std::__cxx11::string::~string((string *)&m1);
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"roughness",(allocator<char> *)&opacity);
      ParameterDictionary::RemoveFloat(pPVar9,&m1);
      std::__cxx11::string::~string((string *)&m1);
    }
    upgradeMaterial::anon_class_24_3_a769f4f6::operator()(&removeParamSilentIfConstant,"Kr",0.0);
    upgradeMaterial::anon_class_24_3_a769f4f6::operator()(&removeParamSilentIfConstant,"Kt",0.0);
    pPVar9 = dict_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
    ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
    std::__cxx11::string::~string((string *)&opacity);
    std::__cxx11::string::~string((string *)&m1);
    pPVar9 = dict_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&opacity,"opacity",(allocator<char> *)&local_e0);
    ParameterDictionary::GetTexture(&m1,pPVar9,(string *)&opacity);
    std::__cxx11::string::~string((string *)&m1);
    std::__cxx11::string::~string((string *)&opacity);
    pPVar9 = dict_local;
    if (m1._M_string_length != 0) {
      (this->super_SceneRepresentation).errorExit = true;
      Error(&loc,
            "Non-opaque \"opacity\" texture in \"uber\" material not supported in pbrt-v4. Please edit the file manually."
           );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&m1);
      goto LAB_00261be5;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m1,"opacity",(allocator<char> *)&local_e0);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    ParameterDictionary::GetSpectrumArray
              ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)&opacity,
               pPVar9,&m1,Unbounded,alloc);
    lVar2 = CONCAT44(opacity._12_4_,opacity.optionalValue._8_4_);
    std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~_Vector_base
              ((_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)&opacity
              );
    std::__cxx11::string::~string((string *)&m1);
    pPVar9 = dict_local;
    if (opacity.optionalValue._0_8_ == lVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&m1);
      goto LAB_00261be5;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m1,"opacity",(allocator<char> *)&local_e0);
    ParameterDictionary::GetOneRGB((ParameterDictionary *)&opacity,(string *)pPVar9);
    std::__cxx11::string::~string((string *)&m1);
    if (opacity.set == true) {
      pRVar6 = pstd::optional<pbrt::RGB>::value(&opacity);
      if ((pRVar6->r == 1.0) && (!NAN(pRVar6->r))) {
        pRVar6 = pstd::optional<pbrt::RGB>::value(&opacity);
        if ((pRVar6->g == 1.0) && (!NAN(pRVar6->g))) {
          pRVar6 = pstd::optional<pbrt::RGB>::value(&opacity);
          pPVar9 = dict_local;
          if ((pRVar6->b == 1.0) && (!NAN(pRVar6->b))) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&m1,"opacity",(allocator<char> *)&local_e0);
            ParameterDictionary::RemoveSpectrum(pPVar9,&m1);
            std::__cxx11::string::~string((string *)&m1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"",(allocator<char> *)&m1);
            pstd::optional<pbrt::RGB>::~optional(&opacity);
            goto LAB_00261be5;
          }
        }
      }
    }
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,
          "A non-opaque \"opacity\" in the \"uber\" material is not supported in pbrt-v4. Please edit the file manually."
         );
    this_01 = &opacity;
LAB_00261b8a:
    pstd::optional<pbrt::RGB>::~optional(this_01);
  }
  else {
    bVar5 = std::operator==(name_local,"mix");
    pPVar3 = dict_local;
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"amount",(allocator<char> *)&opacity);
      ParameterDictionary::GetOneRGB((ParameterDictionary *)&rgb,(string *)pPVar3);
      std::__cxx11::string::~string((string *)&m1);
      pPVar3 = dict_local;
      if (rgb.set == true) {
        pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
        local_e4 = pRVar6->r;
        pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
        if (((float)local_e4 != pRVar6->g) || (NAN((float)local_e4) || NAN(pRVar6->g))) {
LAB_00261829:
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          local_e4 = pRVar6->r;
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          fVar1 = pRVar6->g;
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          avg = (fVar1 + (float)local_e4 + pRVar6->b) / 3.0;
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          pRVar7 = pstd::optional<pbrt::RGB>::value(&rgb);
          pRVar8 = pstd::optional<pbrt::RGB>::value(&rgb);
          in_R8.memoryResource = (memory_resource *)&pRVar8->b;
          args_1 = &pRVar7->g;
          Warning<float&,float&,float&,float&>
                    (&loc,"Changing RGB \"amount\" (%f, %f, %f) to scalar average %f",&pRVar6->r,
                     args_1,(float *)in_R8.memoryResource,&avg);
          indent_abi_cxx11_((string *)&opacity,this,1);
          StringPrintf<float&>(&local_e0,(pbrt *)"\"float amount\" [ %f ]\n",(char *)&avg,args_1);
          std::operator+(&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opacity,&local_e0);
          std::__cxx11::string::append((string *)&extra);
        }
        else {
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          local_e4 = pRVar6->g;
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          if (((float)local_e4 != pRVar6->b) || (NAN((float)local_e4) || NAN(pRVar6->b)))
          goto LAB_00261829;
          indent_abi_cxx11_((string *)&opacity,this,1);
          pRVar6 = pstd::optional<pbrt::RGB>::value(&rgb);
          StringPrintf<float&>
                    (&local_e0,(pbrt *)"\"float amount\" [ %f ]\n",(char *)pRVar6,(float *)pPVar9);
          std::operator+(&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opacity,&local_e0);
          std::__cxx11::string::append((string *)&extra);
        }
        std::__cxx11::string::~string((string *)&m1);
        this_00 = &local_e0;
LAB_00261940:
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::~string((string *)&opacity);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"amount",(allocator<char> *)&local_e0);
        in_R8.memoryResource = pstd::pmr::new_delete_resource();
        ParameterDictionary::GetSpectrumArray
                  ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)&opacity,
                   pPVar3,&m1,Unbounded,in_R8);
        lVar2 = CONCAT44(opacity._12_4_,opacity.optionalValue._8_4_);
        std::_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::
        ~_Vector_base((_Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                      &opacity);
        std::__cxx11::string::~string((string *)&m1);
        pPVar9 = dict_local;
        if (lVar2 != opacity.optionalValue._0_8_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&opacity,"amount",(allocator<char> *)&local_e0);
          ParameterDictionary::ToParameterDefinition(&m1,pPVar9,(string *)&opacity);
          (this->super_SceneRepresentation).errorExit = true;
          Error<std::__cxx11::string>
                    (&loc,"Unable to update non-RGB spectrum \"amount\" to a scalar: %s",&m1);
          this_00 = &m1;
          goto LAB_00261940;
        }
      }
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"amount",(allocator<char> *)&opacity);
      ParameterDictionary::RemoveSpectrum(pPVar9,&m1);
      std::__cxx11::string::~string((string *)&m1);
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opacity,"namedmaterial1",(allocator<char> *)&avg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"",(allocator<char> *)&local_48);
      ParameterDictionary::GetOneString(&m1,pPVar9,(string *)&opacity,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&opacity);
      if (m1._M_string_length == 0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"Didn\'t find \"namedmaterial1\" parameter for \"mix\" material.");
      }
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opacity,"namedmaterial1",(allocator<char> *)&local_e0);
      ParameterDictionary::RemoveString(pPVar9,(string *)&opacity);
      std::__cxx11::string::~string((string *)&opacity);
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"namedmaterial2",(allocator<char> *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>((string *)&avg,"",&local_b9);
      ParameterDictionary::GetOneString((string *)&opacity,pPVar9,&local_e0,(string *)&avg);
      std::__cxx11::string::~string((string *)&avg);
      std::__cxx11::string::~string((string *)&local_e0);
      if (CONCAT44(opacity._12_4_,opacity.optionalValue._8_4_) == 0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"Didn\'t find \"namedmaterial1\" parameter for \"mix\" material.");
      }
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"namedmaterial2",(allocator<char> *)&avg);
      ParameterDictionary::RemoveString(pPVar9,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      indent_abi_cxx11_((string *)&avg,this,1);
      StringPrintf<std::__cxx11::string&,std::__cxx11::string&>
                (&local_48,(pbrt *)"\"string materials\" [ \"%s\" \"%s\" ]\n",(char *)&opacity,&m1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_R8.memoryResource);
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,
                     &local_48);
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&avg);
      std::__cxx11::string::~string((string *)&opacity);
      std::__cxx11::string::~string((string *)&m1);
      this_01 = &rgb;
      goto LAB_00261b8a;
    }
    bVar5 = std::operator==(name_local,"substrate");
    if (bVar5) {
      std::__cxx11::string::assign((char *)name_local);
      upgradeMaterial::anon_class_24_3_a769f4f6::operator()(&removeParamSilentIfConstant,"Ks",1.0);
      pPVar9 = dict_local;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
      ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
      goto LAB_00261589;
    }
    bVar5 = std::operator==(name_local,"glass");
    if (bVar5) {
      std::__cxx11::string::assign((char *)name_local);
      upgradeMaterial::anon_class_24_3_a769f4f6::operator()(&removeParamSilentIfConstant,"Kr",1.0);
      value = 1.0;
      paramName = "Kt";
LAB_0026174d:
      upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                (&removeParamSilentIfConstant,paramName,value);
    }
    else {
      bVar5 = std::operator==(name_local,"plastic");
      if (bVar5) {
        std::__cxx11::string::assign((char *)name_local);
        bVar5 = upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                          (&removeParamSilentIfConstant,"Ks",0.0);
        if (bVar5) {
          std::__cxx11::string::assign((char *)name_local);
          pPVar9 = dict_local;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&m1,"roughness",(allocator<char> *)&opacity);
          ParameterDictionary::RemoveFloat(pPVar9,&m1);
          std::__cxx11::string::~string((string *)&m1);
          pPVar9 = dict_local;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&m1,"eta",(allocator<char> *)&opacity);
          ParameterDictionary::RemoveFloat(pPVar9,&m1);
          std::__cxx11::string::~string((string *)&m1);
        }
        pPVar9 = dict_local;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
        ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
        goto LAB_00261589;
      }
      bVar5 = std::operator==(name_local,"fourier");
      if (bVar5) {
        Warning(&loc,"\"fourier\" material is no longer supported. (But there is \"measured\"!)");
        goto LAB_00261b8f;
      }
      bVar5 = std::operator==(name_local,"kdsubsurface");
      if (bVar5) {
        std::__cxx11::string::assign((char *)name_local);
        pPVar9 = dict_local;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
        ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
LAB_00261589:
        std::__cxx11::string::~string((string *)&opacity);
      }
      else {
        bVar5 = std::operator==(name_local,"matte");
        if (bVar5) {
          std::__cxx11::string::assign((char *)name_local);
          pPVar9 = dict_local;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
          ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
          goto LAB_00261589;
        }
        bVar5 = std::operator==(name_local,"metal");
        if (bVar5) {
          std::__cxx11::string::assign((char *)name_local);
          value = 1.0;
LAB_00261e47:
          paramName = "Kr";
          goto LAB_0026174d;
        }
        bVar5 = std::operator==(name_local,"translucent");
        if (!bVar5) {
          bVar5 = std::operator==(name_local,"mirror");
          if (!bVar5) {
            bVar5 = std::operator==(name_local,"disney");
            if (!bVar5) goto LAB_00261b8f;
            std::__cxx11::string::assign((char *)name_local);
            pPVar9 = dict_local;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&m1,"color",(allocator<char> *)&local_e0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&opacity,"reflectance",(allocator<char> *)&avg);
            ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
            goto LAB_00261589;
          }
          std::__cxx11::string::assign((char *)name_local);
          indent_abi_cxx11_((string *)&opacity,this,1);
          std::operator+(&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opacity,"\"float roughness\" [ 0 ]\n");
          std::__cxx11::string::append((string *)&extra);
          std::__cxx11::string::~string((string *)&m1);
          std::__cxx11::string::~string((string *)&opacity);
          indent_abi_cxx11_((string *)&opacity,this,1);
          std::operator+(&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opacity,"\"spectrum eta\" [ \"metal-Ag-eta\" ]\n");
          std::__cxx11::string::append((string *)&extra);
          std::__cxx11::string::~string((string *)&m1);
          std::__cxx11::string::~string((string *)&opacity);
          indent_abi_cxx11_((string *)&opacity,this,1);
          std::operator+(&m1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &opacity,"\"spectrum k\" [ \"metal-Ag-k\" ]\n");
          std::__cxx11::string::append((string *)&extra);
          std::__cxx11::string::~string((string *)&m1);
          std::__cxx11::string::~string((string *)&opacity);
          value = 0.0;
          goto LAB_00261e47;
        }
        std::__cxx11::string::assign((char *)name_local);
        pPVar9 = dict_local;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"Kd",(allocator<char> *)&local_e0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&opacity,"transmittance",(allocator<char> *)&avg);
        ParameterDictionary::RenameParameter(pPVar9,&m1,(string *)&opacity);
        std::__cxx11::string::~string((string *)&opacity);
        std::__cxx11::string::~string((string *)&m1);
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  (&removeParamSilentIfConstant,"reflect",0.0);
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  (&removeParamSilentIfConstant,"transmit",1.0);
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()(&removeParamSilentIfConstant,"Ks",0.0)
        ;
        pPVar9 = dict_local;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m1,"roughness",(allocator<char> *)&opacity);
        ParameterDictionary::RemoveFloat(pPVar9,&m1);
      }
      std::__cxx11::string::~string((string *)&m1);
    }
  }
LAB_00261b8f:
  sVar4 = extra._M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extra._M_dataplus._M_p == &extra.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(extra.field_2._M_allocated_capacity._1_7_,extra.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = extra.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = extra._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(extra.field_2._M_allocated_capacity._1_7_,extra.field_2._M_local_buf[0]);
  }
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->_M_string_length = sVar4;
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
LAB_00261be5:
  std::__cxx11::string::~string((string *)&extra);
  return __return_storage_ptr__;
}

Assistant:

std::string FormattingScene::upgradeMaterial(std::string *name, ParameterDictionary *dict,
                                             FileLoc loc) const {
    std::string extra = upgradeMaterialIndex(*name, dict, loc);

    dict->RenameParameter("bumpmap", "displacement");

    auto removeParamSilentIfConstant = [&](const char *paramName, Float value) {
        pstd::optional<RGB> rgb = dict->GetOneRGB(paramName);
        bool matches = (rgb && rgb->r == value && rgb->g == value && rgb->b == value);

        if (!matches &&
            !dict->GetSpectrumArray(paramName, SpectrumType::Unbounded, {}).empty())
            Warning(&loc,
                    "Parameter is being removed when converting "
                    "to \"%s\" material: %s",
                    *name, dict->ToParameterDefinition(paramName));
        dict->RemoveSpectrum(paramName);
        dict->RemoveTexture(paramName);
        return matches;
    };

    if (*name == "uber") {
        *name = "coateddiffuse";
        if (removeParamSilentIfConstant("Ks", 0)) {
            *name = "diffuse";
            dict->RemoveFloat("eta");
            dict->RemoveFloat("roughness");
        }
        removeParamSilentIfConstant("Kr", 0);
        removeParamSilentIfConstant("Kt", 0);
        dict->RenameParameter("Kd", "reflectance");

        if (!dict->GetTexture("opacity").empty()) {
            ErrorExitDeferred(&loc, "Non-opaque \"opacity\" texture in \"uber\" "
                                    "material not supported "
                                    "in pbrt-v4. Please edit the file manually.");
            return "";
        }

        if (dict->GetSpectrumArray("opacity", SpectrumType::Unbounded, {}).empty())
            return "";

        pstd::optional<RGB> opacity = dict->GetOneRGB("opacity");
        if (opacity && opacity->r == 1 && opacity->g == 1 && opacity->b == 1) {
            dict->RemoveSpectrum("opacity");
            return "";
        }

        ErrorExitDeferred(&loc, "A non-opaque \"opacity\" in the \"uber\" "
                                "material is not supported "
                                "in pbrt-v4. Please edit the file manually.");
    } else if (*name == "mix") {
        // Convert the amount to a scalar
        pstd::optional<RGB> rgb = dict->GetOneRGB("amount");
        if (rgb) {
            if (rgb->r == rgb->g && rgb->g == rgb->b)
                extra += indent(1) + StringPrintf("\"float amount\" [ %f ]\n", rgb->r);
            else {
                Float avg = (rgb->r + rgb->g + rgb->b) / 3;
                Warning(&loc, "Changing RGB \"amount\" (%f, %f, %f) to scalar average %f",
                        rgb->r, rgb->g, rgb->b, avg);
                extra += indent(1) + StringPrintf("\"float amount\" [ %f ]\n", avg);
            }
        } else if (dict->GetSpectrumArray("amount", SpectrumType::Unbounded, {}).size() >
                   0)
            ErrorExitDeferred(
                &loc, "Unable to update non-RGB spectrum \"amount\" to a scalar: %s",
                dict->ToParameterDefinition("amount"));

        dict->RemoveSpectrum("amount");

        // And rename...
        std::string m1 = dict->GetOneString("namedmaterial1", "");
        if (m1.empty())
            ErrorExitDeferred(
                &loc, "Didn't find \"namedmaterial1\" parameter for \"mix\" material.");
        dict->RemoveString("namedmaterial1");

        std::string m2 = dict->GetOneString("namedmaterial2", "");
        if (m2.empty())
            ErrorExitDeferred(
                &loc, "Didn't find \"namedmaterial1\" parameter for \"mix\" material.");
        dict->RemoveString("namedmaterial2");

        // Note: swapped order vs pbrt-v3!
        extra +=
            indent(1) + StringPrintf("\"string materials\" [ \"%s\" \"%s\" ]\n", m2, m1);
    } else if (*name == "substrate") {
        *name = "coateddiffuse";
        removeParamSilentIfConstant("Ks", 1);
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "glass") {
        *name = "dielectric";
        removeParamSilentIfConstant("Kr", 1);
        removeParamSilentIfConstant("Kt", 1);
    } else if (*name == "plastic") {
        *name = "coateddiffuse";
        if (removeParamSilentIfConstant("Ks", 0)) {
            *name = "diffuse";
            dict->RemoveFloat("roughness");
            dict->RemoveFloat("eta");
        }
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "fourier")
        Warning(&loc, "\"fourier\" material is no longer supported. (But there "
                      "is \"measured\"!)");
    else if (*name == "kdsubsurface") {
        *name = "subsurface";
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "matte") {
        *name = "diffuse";
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "metal") {
        *name = "conductor";
        removeParamSilentIfConstant("Kr", 1);
    } else if (*name == "translucent") {
        *name = "diffusetransmission";

        dict->RenameParameter("Kd", "transmittance");

        removeParamSilentIfConstant("reflect", 0);
        removeParamSilentIfConstant("transmit", 1);

        removeParamSilentIfConstant("Ks", 0);
        dict->RemoveFloat("roughness");
    } else if (*name == "mirror") {
        *name = "conductor";
        extra += indent(1) + "\"float roughness\" [ 0 ]\n";
        extra += indent(1) + "\"spectrum eta\" [ \"metal-Ag-eta\" ]\n";
        extra += indent(1) + "\"spectrum k\" [ \"metal-Ag-k\" ]\n";

        removeParamSilentIfConstant("Kr", 0);
    } else if (*name == "disney") {
        *name = "diffuse";
        dict->RenameParameter("color", "reflectance");
    }

    return extra;
}